

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,string *cond,Type type,string *m_key_name,string *description,
          vector<RPCResult,_std::allocator<RPCResult>_> *inner)

{
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RCX;
  undefined4 in_EDX;
  RPCResult *in_RSI;
  string *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  string *in_stack_ffffffffffffff48;
  undefined1 optional;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  Type type_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  optional = (undefined1)((ulong)in_R9 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = &local_28;
  pvVar2 = in_RCX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),pbVar1);
  type_00 = (Type)((ulong)pvVar2 >> 0x20);
  uVar3 = in_EDX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffff28),pbVar1);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffff28),pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff80;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_stack_fffffffffffffee8,(vector<RPCResult,_std::allocator<RPCResult>_> *)0x12cebd0);
  RPCResult(in_RSI,(string *)CONCAT44(uVar3,in_stack_ffffffffffffff68),type_00,in_R8,(bool)optional,
            in_stack_ffffffffffffff48,
            (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffff90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_RCX);
  std::__cxx11::string::~string(pbVar1);
  std::__cxx11::string::~string(pbVar1);
  std::__cxx11::string::~string(pbVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        std::string cond,
        Type type,
        std::string m_key_name,
        std::string description,
        std::vector<RPCResult> inner = {})
        : RPCResult{std::move(cond), type, std::move(m_key_name), /*optional=*/false, std::move(description), std::move(inner)} {}